

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

string * duckdb::Binder::ReplaceColumnsAlias
                   (string *__return_storage_ptr__,string *alias,string *column_name,
                   optional_ptr<duckdb_re2::RE2,_true> regex)

{
  char cVar1;
  pointer pcVar2;
  RE2 *re;
  BinderException *pBVar3;
  ulong uVar4;
  string extracted;
  optional_ptr<duckdb_re2::RE2,_true> regex_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  StringPiece local_b0;
  StringPiece local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  regex_local = regex;
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar4 = 0;
  do {
    if (alias->_M_string_length <= uVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (alias->_M_dataplus)._M_p;
    if (pcVar2[uVar4] == '\\') {
      uVar4 = uVar4 + 1;
      if (alias->_M_string_length <= uVar4) {
        pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&extracted,
                   "Unterminated backslash in COLUMNS(*) \"%s\" alias. Backslashes must either be escaped or followed by a number"
                   ,(allocator *)&local_d0);
        ::std::__cxx11::string::string((string *)&local_70,(string *)alias);
        BinderException::BinderException<std::__cxx11::string>(pBVar3,&extracted,&local_70);
        __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      cVar1 = pcVar2[uVar4];
      if (cVar1 == '\\') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&extracted,
                     "Invalid backslash code in COLUMNS(*) \"%s\" alias. Backslashes must either be escaped or followed by a number"
                     ,(allocator *)&local_d0);
          ::std::__cxx11::string::string((string *)&local_90,(string *)alias);
          BinderException::BinderException<std::__cxx11::string>(pBVar3,&extracted,&local_90);
          __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (cVar1 == '0') {
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          if (regex_local.ptr == (RE2 *)0x0) {
            pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&extracted,
                       "Only the backslash escape code \\0 can be used when no regex is supplied to COLUMNS(*)"
                       ,(allocator *)&local_d0);
            BinderException::BinderException(pBVar3,&extracted);
            __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          extracted._M_dataplus._M_p = (pointer)&extracted.field_2;
          extracted._M_string_length = 0;
          extracted.field_2._M_local_buf[0] = '\0';
          local_b0.data_ = (column_name->_M_dataplus)._M_p;
          local_b0.size_ = column_name->_M_string_length;
          re = optional_ptr<duckdb_re2::RE2,_true>::operator*(&regex_local);
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)alias);
          ::std::operator+(&local_d0,"\\",&local_50);
          local_a0.data_ = local_d0._M_dataplus._M_p;
          local_a0.size_ = local_d0._M_string_length;
          duckdb_re2::RE2::Extract(&local_b0,re,&local_a0,&extracted);
          ::std::__cxx11::string::~string((string *)&local_d0);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&extracted);
        }
      }
    }
    else {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

string Binder::ReplaceColumnsAlias(const string &alias, const string &column_name,
                                   optional_ptr<duckdb_re2::RE2> regex) {
	string result;
	result.reserve(alias.size());
	for (idx_t c = 0; c < alias.size(); c++) {
		if (alias[c] == '\\') {
			c++;
			if (c >= alias.size()) {
				throw BinderException("Unterminated backslash in COLUMNS(*) \"%s\" alias. Backslashes must either be "
				                      "escaped or followed by a number",
				                      alias);
			}
			if (alias[c] == '\\') {
				result += "\\";
				continue;
			}
			if (alias[c] < '0' || alias[c] > '9') {
				throw BinderException("Invalid backslash code in COLUMNS(*) \"%s\" alias. Backslashes must either be "
				                      "escaped or followed by a number",
				                      alias);
			}
			if (alias[c] == '0') {
				result += column_name;
			} else if (!regex) {
				throw BinderException(
				    "Only the backslash escape code \\0 can be used when no regex is supplied to COLUMNS(*)");
			} else {
				string extracted;
				RE2::Extract(column_name, *regex, "\\" + alias.substr(c, 1), &extracted);
				result += extracted;
			}
		} else {
			result += alias[c];
		}
	}
	return result;
}